

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O1

kbool_t LoadPlatformModule(KonohaFactory *factory,char *moduleName,ModuleType type)

{
  kbool_t kVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  code *pcVar5;
  char *pcVar6;
  bool bVar7;
  char funcbuf [256];
  char pathbuf [4096];
  
  pcVar3 = (*factory->getenv_i)("KONOHA_HOME");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (*factory->getenv_i)("HOME");
    pcVar6 = "/.konoha/module";
  }
  else {
    pcVar6 = "/module";
  }
  snprintf(pathbuf,0x1000,"%s%s/%s/%s%s",pcVar3,pcVar6,moduleName,moduleName,".so");
  kVar1 = HasFile(pathbuf);
  if (!kVar1) {
    snprintf(pathbuf,0x1000,"/usr/local/lib/konoha/3.0/module/%s/%s%s",moduleName,moduleName,".so");
  }
  kVar1 = HasFile(pathbuf);
  if (kVar1) {
    lVar4 = dlopen(pathbuf,1);
    if (lVar4 == 0) {
      bVar7 = true;
      pcVar5 = (code *)0x0;
    }
    else {
      snprintf(funcbuf,0x100,"Load%sModule",moduleName);
      pcVar5 = (code *)dlsym(lVar4,funcbuf);
      bVar7 = pcVar5 == (code *)0x0;
      if (!bVar7) {
        pcVar5 = (code *)(*pcVar5)(factory,type);
      }
    }
    bVar2 = (byte)pcVar5;
    if (!bVar7) goto LAB_0010313f;
  }
  bVar2 = 0;
LAB_0010313f:
  return (kbool_t)(bVar2 & 1);
}

Assistant:

static kbool_t LoadPlatformModule(KonohaFactory *factory, const char *moduleName, ModuleType type)
{
	char pathbuf[K_PATHMAX];
	if(FormatModulePath(factory, pathbuf, sizeof(pathbuf), moduleName, K_OSDLLEXT)) {
		void *gluehdr = dlopen(pathbuf, RTLD_LAZY);  // don't close until the program ends
		if(gluehdr != NULL) {
			char funcbuf[256];
			snprintf(funcbuf, sizeof(funcbuf), "Load%sModule", moduleName);
			ModuleLoadFunc load = (ModuleLoadFunc)dlsym(gluehdr, funcbuf);
			if(load != NULL) {
				return load(factory, type);
			}
		}
	}
	return false;
}